

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

aiNode * __thiscall Assimp::D3MF::XmlSerializer::ReadObject(XmlSerializer *this,aiScene *scene)

{
  XmlReader *pXVar1;
  bool bVar2;
  int iVar3;
  aiNode *paVar4;
  undefined8 uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer paVar6;
  undefined4 extraout_var_01;
  size_type sVar7;
  uint *puVar8;
  iterator __first;
  iterator __last;
  aiMesh *local_a8;
  aiMesh *local_a0;
  aiMesh *mesh;
  size_t meshIdx;
  string type;
  string name;
  char *attrib;
  vector<unsigned_long,_std::allocator<unsigned_long>_> meshIds;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> local_20;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  aiScene *scene_local;
  XmlSerializer *this_local;
  
  node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
       (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)scene;
  paVar4 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar4);
  std::unique_ptr<aiNode,std::default_delete<aiNode>>::unique_ptr<std::default_delete<aiNode>,void>
            ((unique_ptr<aiNode,std::default_delete<aiNode>> *)&local_20,paVar4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&attrib);
  std::__cxx11::string::string((string *)(type.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&meshIdx);
  pXVar1 = this->xmlReader;
  uVar5 = std::__cxx11::string::c_str();
  iVar3 = (*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar5);
  if ((char *)CONCAT44(extraout_var,iVar3) != (char *)0x0) {
    std::__cxx11::string::operator=
              ((string *)(type.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var,iVar3));
  }
  pXVar1 = this->xmlReader;
  uVar5 = std::__cxx11::string::c_str();
  iVar3 = (*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar5);
  if ((char *)CONCAT44(extraout_var_00,iVar3) != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&meshIdx,(char *)CONCAT44(extraout_var_00,iVar3));
  }
  paVar4 = *(aiNode **)
            ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                   super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 8);
  paVar6 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_20);
  paVar6->mParent = paVar4;
  paVar6 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_20);
  aiString::Set(&paVar6->mName,(string *)((long)&type.field_2 + 8));
  mesh = (aiMesh *)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->mMeshes);
  while (bVar2 = ReadToEndElement(this,(string *)XmlTag::object_abi_cxx11_), bVar2) {
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    bVar2 = std::operator==((char *)CONCAT44(extraout_var_01,iVar3),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            XmlTag::mesh_abi_cxx11_);
    if (bVar2) {
      local_a0 = ReadMesh(this);
      aiString::Set(&local_a0->mName,(string *)((long)&type.field_2 + 8));
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&this->mMeshes,&local_a0);
      local_a8 = mesh;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&attrib,
                 (value_type_conflict7 *)&local_a8);
      mesh = (aiMesh *)((long)&mesh->mPrimitiveTypes + 1);
    }
  }
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&attrib);
  paVar6 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_20);
  paVar6->mNumMeshes = (uint)sVar7;
  paVar6 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_20);
  puVar8 = (uint *)operator_new__((ulong)paVar6->mNumMeshes << 2);
  paVar6 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_20);
  paVar6->mMeshes = puVar8;
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&attrib);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&attrib);
  paVar6 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_20);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_int*>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current,paVar6->mMeshes);
  paVar6 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::release(&local_20);
  std::__cxx11::string::~string((string *)&meshIdx);
  std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&attrib);
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr(&local_20);
  return paVar6;
}

Assistant:

aiNode* ReadObject(aiScene* scene) {
        std::unique_ptr<aiNode> node(new aiNode());

        std::vector<unsigned long> meshIds;

        const char *attrib( nullptr );
        std::string name, type;
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::id.c_str() );
        if ( nullptr != attrib ) {
            name = attrib;
        }
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::type.c_str() );
        if ( nullptr != attrib ) {
            type = attrib;
        }

        node->mParent = scene->mRootNode;
        node->mName.Set(name);

        size_t meshIdx = mMeshes.size();

        while(ReadToEndElement(D3MF::XmlTag::object)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::mesh) {
                auto mesh = ReadMesh();

                mesh->mName.Set(name);
                mMeshes.push_back(mesh);
                meshIds.push_back(static_cast<unsigned long>(meshIdx));
                ++meshIdx;
            }
        }

        node->mNumMeshes = static_cast<unsigned int>(meshIds.size());

        node->mMeshes = new unsigned int[node->mNumMeshes];

        std::copy(meshIds.begin(), meshIds.end(), node->mMeshes);

        return node.release();
    }